

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O3

void __thiscall
CoreML::Specification::SupportVectorClassifier::_internal_add_numberofsupportvectorsperclass
          (SupportVectorClassifier *this,int32_t value)

{
  RepeatedField<int> *this_00;
  uint uVar1;
  int *piVar2;
  int tmp;
  
  this_00 = &this->numberofsupportvectorsperclass_;
  uVar1 = (this->numberofsupportvectorsperclass_).current_size_;
  if (uVar1 == (this->numberofsupportvectorsperclass_).total_size_) {
    google::protobuf::RepeatedField<int>::Reserve(this_00,uVar1 + 1);
    piVar2 = google::protobuf::RepeatedField<int>::elements(this_00);
    piVar2[uVar1] = value;
  }
  else {
    piVar2 = google::protobuf::RepeatedField<int>::elements(this_00);
    piVar2[uVar1] = value;
  }
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void SupportVectorClassifier::_internal_add_numberofsupportvectorsperclass(int32_t value) {
  numberofsupportvectorsperclass_.Add(value);
}